

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O3

void gena_process_subscription_request(SOCKINFO *info,http_message_t *request)

{
  Upnp_FunPtr p_Var1;
  int iVar2;
  Upnp_Handle_Type UVar3;
  parse_status_t pVar4;
  uint uVar5;
  int iVar6;
  UpnpSubscriptionRequest *p;
  http_header_t *phVar7;
  char *pcVar8;
  subscription *head;
  time_t tVar9;
  time_t tVar10;
  int time_out;
  Handle_Info *handle_info;
  service_info *service;
  memptr timeout_hdr;
  UpnpDevice_Handle device_handle;
  memptr callback_hdr;
  memptr nt_hdr;
  uuid_upnp uid;
  Upnp_SID temp_sid;
  int local_c4;
  Handle_Info *local_c0;
  service_info *local_b8;
  memptr local_b0;
  UpnpDevice_Handle local_9c;
  memptr local_98;
  memptr local_88;
  uuid_upnp local_78;
  char local_68 [56];
  
  p = UpnpSubscriptionRequest_new();
  local_c4 = 0x709;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x548,"Subscription Request Received:\n")
  ;
  phVar7 = httpmsg_find_hdr(request,0xe,&local_88);
  if (phVar7 == (http_header_t *)0x0) {
LAB_001180bd:
    iVar2 = 400;
  }
  else {
    iVar2 = memptr_cmp_nocase(&local_88,"upnp:event");
    if (iVar2 == 0) {
      phVar7 = httpmsg_find_hdr(request,0x12,(memptr *)0x0);
      if (phVar7 != (http_header_t *)0x0) goto LAB_001180bd;
      pcVar8 = str_alloc((request->uri).pathquery.buff,(request->uri).pathquery.size);
      if (pcVar8 != (char *)0x0) {
        iVar2 = 2;
        UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x569,
                   "SubscriptionRequest for event URL path: %s\n",pcVar8);
        HandleLock((char *)0x56d,iVar2);
        UVar3 = GetDeviceHandleInfoForPath
                          (pcVar8,(uint)(info->foreign_sockaddr).ss_family,&local_9c,&local_c0,
                           &local_b8);
        free(pcVar8);
        if (UVar3 == HND_DEVICE) {
          if ((local_b8 == (service_info *)0x0) || (local_b8->active == 0)) {
            iVar2 = 0x194;
            error_respond(info,0x194,request);
            pcVar8 = (char *)0x57d;
          }
          else {
            UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x584,
                       "Subscription Request: Number of Subscriptions already %d\n Max Subscriptions allowed: %d\n"
                       ,(ulong)(uint)local_b8->TotalSubscriptions,local_c0->MaxSubscriptions);
            if ((local_c0->MaxSubscriptions == -1) ||
               (local_b8->TotalSubscriptions < local_c0->MaxSubscriptions)) {
              head = (subscription *)malloc(0xc0);
              if (head == (subscription *)0x0) {
                iVar2 = 500;
                error_respond(info,500,request);
                pcVar8 = (char *)0x595;
              }
              else {
                head->ToSendEventKey = 0;
                head->active = 0;
                head->next = (SUBSCRIPTION *)0x0;
                (head->DeliveryURLs).size = 0;
                (head->DeliveryURLs).URLs = (char *)0x0;
                (head->DeliveryURLs).parsedURLs = (uri_type *)0x0;
                iVar2 = ListInit(&head->outgoing,(cmp_routine)0x0,free);
                if (iVar2 == 0) {
                  phVar7 = httpmsg_find_hdr(request,2,&local_98);
                  if (phVar7 == (http_header_t *)0x0) {
                    iVar2 = 0x19c;
                    error_respond(info,0x19c,request);
                    freeSubscriptionList(head);
                    pcVar8 = (char *)0x5a8;
                  }
                  else {
                    iVar2 = create_url_list((memptr *)local_98.buf,(URL_list *)local_98.length);
                    if (iVar2 == -0x68) {
                      iVar2 = 500;
                      error_respond(info,500,request);
                      freeSubscriptionList(head);
                      pcVar8 = (char *)0x5b5;
                    }
                    else if (iVar2 == 0) {
                      iVar2 = 0x19c;
                      error_respond(info,0x19c,request);
                      freeSubscriptionList(head);
                      pcVar8 = (char *)0x5af;
                    }
                    else {
                      iVar2 = gena_validate_delivery_urls(info,&head->DeliveryURLs);
                      if (iVar2 == 0) {
                        phVar7 = httpmsg_find_hdr(request,0x15,&local_b0);
                        if (phVar7 != (http_header_t *)0x0) {
                          pVar4 = matchstr(local_b0.buf,local_b0.length,"%iSecond-%d%0",&local_c4);
                          if (pVar4 != PARSE_OK) {
                            iVar2 = memptr_cmp_nocase(&local_b0,"Second-infinite");
                            if (iVar2 == 0) {
                              local_c4 = -1;
                            }
                            else {
                              local_c4 = 0x709;
                            }
                          }
                        }
                        iVar2 = local_c0->MaxSubscriptionTimeOut;
                        if ((iVar2 != -1) && (local_c4 == -1 || iVar2 < local_c4)) {
                          local_c4 = iVar2;
                        }
                        if (local_c4 < 0) {
                          tVar10 = 0;
                        }
                        else {
                          tVar9 = time((time_t *)0x0);
                          tVar10 = local_c4 + tVar9;
                        }
                        head->expireTime = tVar10;
                        uuid_create(&local_78);
                        upnp_uuid_unpack(&local_78,local_68);
                        iVar2 = 0x2c;
                        uVar5 = snprintf((char *)head,0x2c,"uuid:%s",local_68);
                        if (uVar5 < 0x2c) {
                          iVar2 = local_c4;
                          iVar6 = respond_ok(info,local_c4,head,request);
                          if (iVar6 == 0) {
                            head->next = local_b8->subscriptionList;
                            local_b8->subscriptionList = head;
                            local_b8->TotalSubscriptions = local_b8->TotalSubscriptions + 1;
                            UpnpSubscriptionRequest_strcpy_ServiceId(p,local_b8->serviceId);
                            UpnpSubscriptionRequest_strcpy_UDN(p,local_b8->UDN);
                            UpnpSubscriptionRequest_strcpy_SID(p,(char *)head);
                            p_Var1 = local_c0->Callback;
                            pcVar8 = local_c0->Cookie;
                            HandleUnlock((char *)0x5f8,(int)head);
                            (*p_Var1)(UPNP_EVENT_SUBSCRIPTION_REQUEST,p,pcVar8);
                            goto LAB_001180cd;
                          }
                        }
                        freeSubscriptionList(head);
                        pcVar8 = (char *)0x5e6;
                      }
                      else {
                        iVar2 = 0x19c;
                        error_respond(info,0x19c,request);
                        freeSubscriptionList(head);
                        pcVar8 = (char *)0x5bc;
                      }
                    }
                  }
                }
                else {
                  iVar2 = 500;
                  error_respond(info,500,request);
                  pcVar8 = (char *)0x5a0;
                }
              }
            }
            else {
              iVar2 = 500;
              error_respond(info,500,request);
              pcVar8 = (char *)0x58e;
            }
          }
        }
        else {
          iVar2 = 500;
          error_respond(info,500,request);
          pcVar8 = (char *)0x576;
        }
        HandleUnlock(pcVar8,iVar2);
        goto LAB_001180cd;
      }
      iVar2 = 500;
    }
    else {
      iVar2 = 0x19c;
    }
  }
  error_respond(info,iVar2,request);
LAB_001180cd:
  UpnpSubscriptionRequest_delete(p);
  return;
}

Assistant:

void gena_process_subscription_request(SOCKINFO *info, http_message_t *request)
{
	UpnpSubscriptionRequest *request_struct = UpnpSubscriptionRequest_new();
	Upnp_SID temp_sid;
	int return_code = 1;
	int time_out = 1801;
	service_info *service;
	subscription *sub;
	uuid_upnp uid;
	struct Handle_Info *handle_info;
	void *cookie;
	Upnp_FunPtr callback_fun;
	UpnpDevice_Handle device_handle;
	memptr nt_hdr;
	char *event_url_path = NULL;
	memptr callback_hdr;
	memptr timeout_hdr;
	int rc = 0;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request Received:\n");

	if (httpmsg_find_hdr(request, HDR_NT, &nt_hdr) == NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}

	/* check NT header */
	/* Windows Millenium Interoperability: */
	/* we accept either upnp:event, or upnp:propchange for the NT header */
	if (memptr_cmp_nocase(&nt_hdr, "upnp:event") != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		goto exit_function;
	}

	/* if a SID is present then the we have a bad request "incompatible
	 * headers" */
	if (httpmsg_find_hdr(request, HDR_SID, NULL) != NULL) {
		error_respond(info, HTTP_BAD_REQUEST, request);
		goto exit_function;
	}
	/* look up service by eventURL */
	event_url_path = str_alloc(
		request->uri.pathquery.buff, request->uri.pathquery.size);
	if (event_url_path == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"SubscriptionRequest for event URL path: %s\n",
		event_url_path);

	HandleLock(__FILE__, __LINE__);

	if (GetDeviceHandleInfoForPath(event_url_path,
		    info->foreign_sockaddr.ss_family,
		    &device_handle,
		    &handle_info,
		    &service) != HND_DEVICE) {
		free(event_url_path);
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	free(event_url_path);

	if (service == NULL || !service->active) {
		error_respond(info, HTTP_NOT_FOUND, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"Subscription Request: Number of Subscriptions already %d\n "
		"Max Subscriptions allowed: %d\n",
		service->TotalSubscriptions,
		handle_info->MaxSubscriptions);

	/* too many subscriptions */
	if (handle_info->MaxSubscriptions != -1 &&
		service->TotalSubscriptions >= handle_info->MaxSubscriptions) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* generate new subscription */
	sub = (subscription *)malloc(sizeof(subscription));
	if (sub == NULL) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	sub->ToSendEventKey = 0;
	sub->active = 0;
	sub->next = NULL;
	sub->DeliveryURLs.size = 0;
	sub->DeliveryURLs.URLs = NULL;
	sub->DeliveryURLs.parsedURLs = NULL;
	if (ListInit(&sub->outgoing, 0, free) != 0) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}

	/* check for valid callbacks */
	if (httpmsg_find_hdr(request, HDR_CALLBACK, &callback_hdr) == NULL) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = create_url_list(&callback_hdr, &sub->DeliveryURLs);
	if (return_code == 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	if (return_code == UPNP_E_OUTOF_MEMORY) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	return_code = gena_validate_delivery_urls(info, &sub->DeliveryURLs);
	if (return_code != 0) {
		error_respond(info, HTTP_PRECONDITION_FAILED, request);
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* set the timeout */
	if (httpmsg_find_hdr(request, HDR_TIMEOUT, &timeout_hdr) != NULL) {
		if (matchstr(timeout_hdr.buf,
			    timeout_hdr.length,
			    "%iSecond-%d%0",
			    &time_out) == PARSE_OK) {
			/* nothing */
		} else if (memptr_cmp_nocase(&timeout_hdr, "Second-infinite") ==
			   0) {
			/* infinite timeout */
			time_out = -1;
		} else {
			/* default is > 1800 seconds */
			time_out = DEFAULT_TIMEOUT;
		}
	}
	/* replace infinite timeout with max timeout, if possible */
	if (handle_info->MaxSubscriptionTimeOut != -1) {
		if (time_out == -1 ||
			time_out > handle_info->MaxSubscriptionTimeOut) {
			time_out = handle_info->MaxSubscriptionTimeOut;
		}
	}
	if (time_out >= 0) {
		sub->expireTime = time(NULL) + time_out;
	} else {
		/* infinite time */
		sub->expireTime = 0;
	}

	/* generate SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(sub->sid, sizeof(sub->sid), "uuid:%s", temp_sid);

	/* respond OK */
	if (rc < 0 || (unsigned int)rc >= sizeof(sub->sid) ||
		(respond_ok(info, time_out, sub, request) != UPNP_E_SUCCESS)) {
		freeSubscriptionList(sub);
		HandleUnlock(__FILE__, __LINE__);
		goto exit_function;
	}
	/* add to subscription list */
	sub->next = service->subscriptionList;
	service->subscriptionList = sub;
	service->TotalSubscriptions++;

	/* finally generate callback for init table dump */
	UpnpSubscriptionRequest_strcpy_ServiceId(
		request_struct, service->serviceId);
	UpnpSubscriptionRequest_strcpy_UDN(request_struct, service->UDN);
	UpnpSubscriptionRequest_strcpy_SID(request_struct, sub->sid);

	/* copy callback */
	callback_fun = handle_info->Callback;
	cookie = handle_info->Cookie;

	HandleUnlock(__FILE__, __LINE__);

	/* make call back with request struct */
	/* in the future should find a way of mainting that the handle */
	/* is not unregistered in the middle of a callback */
	callback_fun(UPNP_EVENT_SUBSCRIPTION_REQUEST, request_struct, cookie);

exit_function:
	UpnpSubscriptionRequest_delete(request_struct);
}